

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_follow(SessionHandle *data,char *newurl,followtype type)

{
  byte bVar1;
  int iVar2;
  char *sep;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  size_t __n;
  char *ptr;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  long lVar9;
  char cVar10;
  size_t newlen_1;
  long lVar11;
  char cVar12;
  char *iptr_1;
  char *pcVar13;
  char prot [16];
  undefined1 local_71;
  char *local_70;
  int local_64;
  char *local_60;
  char *local_58;
  followtype local_4c;
  undefined1 local_48 [24];
  
  if (type == FOLLOW_REDIR) {
    lVar11 = (data->set).followlocation;
    lVar9 = (data->set).maxredirs;
    if (lVar9 <= lVar11 && lVar9 != -1) {
      Curl_failf(data,"Maximum (%ld) redirects followed");
      return CURLE_TOO_MANY_REDIRECTS;
    }
    (data->state).this_is_a_follow = true;
    (data->set).followlocation = lVar11 + 1;
    if ((data->set).http_auto_referer == true) {
      if ((data->change).referer_alloc == true) {
        pcVar3 = (data->change).referer;
        if (pcVar3 != (char *)0x0) {
          (*Curl_cfree)(pcVar3);
          (data->change).referer = (char *)0x0;
        }
        (data->change).referer_alloc = false;
      }
      pcVar3 = (*Curl_cstrdup)((data->change).url);
      (data->change).referer = pcVar3;
      if (pcVar3 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      (data->change).referer_alloc = true;
    }
  }
  iVar2 = __isoc99_sscanf(newurl,"%15[^?&/:]://%c",local_48,&local_71);
  if (iVar2 != 2) {
    local_64 = iVar2;
    pcVar3 = (*Curl_cstrdup)((data->change).url);
    if (pcVar3 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_4c = type;
    pcVar6 = strstr(pcVar3,"//");
    pcVar4 = pcVar6 + 2;
    if (pcVar6 == (char *)0x0) {
      pcVar4 = pcVar3;
    }
    cVar10 = *newurl;
    local_70 = pcVar3;
    local_58 = newurl;
    if (cVar10 == '/') {
      if (newurl[1] == '/') {
        *pcVar4 = '\0';
        pcVar13 = newurl + 2;
      }
      else {
        local_60 = pcVar4;
        pcVar6 = strchr(pcVar4,0x2f);
        pcVar5 = strchr(pcVar4,0x3f);
        pcVar4 = local_60;
        pcVar13 = newurl;
        if (pcVar6 == (char *)0x0) {
          if (pcVar5 != (char *)0x0) {
            *pcVar5 = '\0';
          }
        }
        else {
          pcVar7 = pcVar6;
          if (pcVar5 < pcVar6) {
            pcVar7 = pcVar5;
          }
          if (pcVar5 == (char *)0x0) {
            pcVar7 = pcVar6;
          }
          *pcVar7 = '\0';
        }
      }
    }
    else {
      pcVar3 = strchr(pcVar4,0x3f);
      if (pcVar3 != (char *)0x0) {
        *pcVar3 = '\0';
        cVar10 = *newurl;
      }
      cVar12 = '?';
      if ((cVar10 != '?') && (pcVar3 = strrchr(pcVar4,0x2f), cVar12 = cVar10, pcVar3 != (char *)0x0)
         ) {
        *pcVar3 = '\0';
        cVar12 = *local_58;
      }
      pcVar3 = strchr(pcVar4,0x2f);
      pcVar4 = pcVar3 + 1;
      pcVar6 = pcVar4;
      if (pcVar3 == (char *)0x0) {
        pcVar6 = (char *)0x0;
      }
      pcVar13 = local_58;
      iVar2 = 0;
      if ((cVar12 == '.') &&
         (pcVar13 = local_58 + (ulong)(local_58[1] == '/') * 2, iVar2 = 0, *pcVar13 == '.')) {
        iVar2 = 0;
        pcVar5 = pcVar13;
        do {
          pcVar13 = pcVar5;
          if ((pcVar5[1] != '.') || (pcVar5[2] != '/')) break;
          iVar2 = iVar2 + 1;
          pcVar13 = pcVar5 + 3;
          pcVar7 = pcVar5 + 3;
          pcVar5 = pcVar13;
        } while (*pcVar7 == '.');
      }
      local_60 = pcVar4;
      if (pcVar3 == (char *)0x0) {
        local_60 = (char *)0x0;
        pcVar3 = local_70;
        pcVar4 = local_60;
      }
      else {
        for (; pcVar3 = local_70, iVar2 != 0; iVar2 = iVar2 + -1) {
          pcVar3 = strrchr(pcVar6,0x2f);
          if (pcVar3 == (char *)0x0) {
            *pcVar6 = '\0';
            pcVar3 = local_70;
            pcVar4 = local_60;
            break;
          }
          *pcVar3 = '\0';
          pcVar4 = pcVar6;
        }
      }
    }
    local_60 = pcVar4;
    bVar1 = 1;
    lVar11 = 0;
    pcVar4 = pcVar13;
    do {
      cVar10 = *pcVar4;
      if (cVar10 == ' ') {
        lVar9 = (ulong)bVar1 * 2 + 1;
      }
      else {
        lVar9 = 1;
        if (cVar10 == '?') {
          bVar1 = 0;
        }
        else if (cVar10 == '\0') goto LAB_0056452d;
      }
      lVar11 = lVar11 + lVar9;
      pcVar4 = pcVar4 + 1;
    } while( true );
  }
  pcVar3 = strchr(newurl,0x20);
  if (pcVar3 != (char *)0x0) {
    bVar1 = 1;
    lVar11 = 0;
    pcVar3 = newurl;
    do {
      cVar10 = *pcVar3;
      if (cVar10 == ' ') {
        lVar9 = (ulong)bVar1 * 2 + 1;
      }
      else {
        lVar9 = 1;
        if (cVar10 == '?') {
          bVar1 = 0;
        }
        else if (cVar10 == '\0') goto LAB_00564338;
      }
      lVar11 = lVar11 + lVar9;
      pcVar3 = pcVar3 + 1;
    } while( true );
  }
  if (type == FOLLOW_FAKE) goto LAB_00564611;
  goto LAB_00564623;
LAB_0056452d:
  __n = strlen(pcVar3);
  pcVar4 = (char *)(*Curl_cmalloc)(__n + lVar11 + 2);
  if (pcVar4 == (char *)0x0) {
    (*Curl_cfree)(pcVar3);
    return CURLE_OUT_OF_MEMORY;
  }
  memcpy(pcVar4,pcVar3,__n);
  iVar2 = local_64;
  cVar10 = *pcVar13;
  if (cVar10 != '/') {
    if (local_60 == (char *)0x0) {
      if (cVar10 == '?') goto LAB_005645a3;
    }
    else if ((cVar10 == '?') || (*local_60 == '\0')) goto LAB_005645a3;
    pcVar4[__n] = '/';
    __n = __n + 1;
  }
LAB_005645a3:
  pcVar3 = pcVar4 + __n;
  bVar8 = true;
  do {
    cVar10 = *pcVar13;
    if (cVar10 == ' ') {
      if (bVar8) {
        pcVar3[0] = '%';
        pcVar3[1] = '2';
        pcVar3[2] = '0';
        pcVar3 = pcVar3 + 3;
        bVar8 = true;
      }
      else {
        *pcVar3 = '+';
        pcVar3 = pcVar3 + 1;
        bVar8 = false;
      }
    }
    else {
      if (cVar10 == '?') {
        bVar8 = false;
      }
      else if (cVar10 == '\0') break;
      *pcVar3 = cVar10;
      pcVar3 = pcVar3 + 1;
    }
    pcVar13 = pcVar13 + 1;
  } while( true );
  *pcVar3 = '\0';
  (*Curl_cfree)(local_70);
  (*Curl_cfree)(local_58);
  type = local_4c;
  goto LAB_0056460c;
LAB_00564338:
  pcVar4 = (char *)(*Curl_cmalloc)(lVar11 + 1);
  if (pcVar4 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  bVar8 = true;
  pcVar3 = pcVar4;
  pcVar6 = newurl;
  do {
    cVar10 = *pcVar6;
    if (cVar10 == ' ') {
      if (bVar8) {
        pcVar3[0] = '%';
        pcVar3[1] = '2';
        pcVar3[2] = '0';
        pcVar3 = pcVar3 + 3;
        bVar8 = true;
      }
      else {
        *pcVar3 = '+';
        pcVar3 = pcVar3 + 1;
        bVar8 = false;
      }
    }
    else {
      if (cVar10 == '?') {
        bVar8 = false;
      }
      else if (cVar10 == '\0') break;
      *pcVar3 = cVar10;
      pcVar3 = pcVar3 + 1;
    }
    pcVar6 = pcVar6 + 1;
  } while( true );
  *pcVar3 = '\0';
  (*Curl_cfree)(newurl);
LAB_0056460c:
  newurl = pcVar4;
  if (type == FOLLOW_FAKE) {
LAB_00564611:
    (data->info).wouldredirect = newurl;
    return CURLE_OK;
  }
  if (iVar2 == 2) {
LAB_00564623:
    (data->state).allow_port = false;
  }
  if (((data->change).url_alloc == true) && (pcVar3 = (data->change).url, pcVar3 != (char *)0x0)) {
    (*Curl_cfree)(pcVar3);
  }
  (data->change).url = newurl;
  (data->change).url_alloc = true;
  Curl_infof(data,"Issue another request to this URL: \'%s\'\n",newurl);
  iVar2 = (data->info).httpcode;
  if (iVar2 == 0x12f) {
    if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
      (data->set).httpreq = HTTPREQ_GET;
      pcVar3 = "GET";
      if ((data->set).opt_no_body != false) {
        pcVar3 = "HEAD";
      }
      Curl_infof(data,"Disables POST, goes with %s\n",pcVar3);
    }
  }
  else {
    if (iVar2 == 0x12e) {
      if (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST) goto LAB_00564720;
      bVar1 = (byte)(data->set).keep_post & 2;
    }
    else {
      if ((iVar2 != 0x12d) || (((data->set).httpreq & ~HTTPREQ_GET) != HTTPREQ_POST))
      goto LAB_00564720;
      bVar1 = (byte)(data->set).keep_post & 1;
    }
    if (bVar1 == 0) {
      Curl_infof(data,"Switch from POST to GET\n");
      (data->set).httpreq = HTTPREQ_GET;
    }
  }
LAB_00564720:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct SessionHandle *data,
                     char *newurl, /* this 'newurl' is the Location: string,
                                      and it must be malloc()ed before passed
                                      here */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
        (data->set.followlocation >= data->set.maxredirs)) {
      failf(data,"Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }

    /* mark the next request as a followed location: */
    data->state.this_is_a_follow = TRUE;

    data->set.followlocation++; /* count location-followers */

    if(data->set.http_auto_referer) {
      /* We are asked to automatically set the previous URL as the referer
         when we get the next URL. We pick the ->url field, which may or may
         not be 100% correct */

      if(data->change.referer_alloc) {
        Curl_safefree(data->change.referer);
        data->change.referer_alloc = FALSE;
      }

      data->change.referer = strdup(data->change.url);
      if(!data->change.referer)
        return CURLE_OUT_OF_MEMORY;
      data->change.referer_alloc = TRUE; /* yes, free this later */
    }
  }

  if(!is_absolute_url(newurl))  {
    /***
     *DANG* this is an RFC 2068 violation. The URL is supposed
     to be absolute and this doesn't seem to be that!
     */
    char *absolute = concat_url(data->change.url, newurl);
    if(!absolute)
      return CURLE_OUT_OF_MEMORY;
    free(newurl);
    newurl = absolute;
  }
  else {
    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

    if(strchr(newurl, ' ')) {
      /* This new URL contains at least one space, this is a mighty stupid
         redirect but we still make an effort to do "right". */
      char *newest;
      size_t newlen = strlen_url(newurl);

      newest = malloc(newlen+1); /* get memory for this */
      if(!newest)
        return CURLE_OUT_OF_MEMORY;
      strcpy_url(newest, newurl); /* create a space-free URL */

      free(newurl); /* that was no good */
      newurl = newest; /* use this instead now */
    }

  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  data->change.url = newurl;
  data->change.url_alloc = TRUE;
  newurl = NULL; /* don't free! */

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitely
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTimesSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}